

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Type * __thiscall soul::heart::ArrayElement::getType(ArrayElement *this)

{
  Category CVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ArraySize newSize;
  Type TStack_38;
  Type *this_00;
  
  iVar3 = (*(((this->parent).object)->super_Object)._vptr_Object[2])();
  this_00 = (Type *)CONCAT44(extraout_var,iVar3);
  newSize = this->fixedEndIndex - this->fixedStartIndex;
  CVar1 = this_00->category;
  if (newSize == 1 || (this->dynamicIndex).object != (Expression *)0x0) {
    if (CVar1 == primitive) {
      Type::operator=(&this->temporaryType,this_00);
      goto LAB_0026c11e;
    }
    Type::getElementType(&TStack_38,this_00);
    Type::operator=(&this->temporaryType,&TStack_38);
  }
  else {
    if (CVar1 == vector) {
LAB_0026c0cf:
      bVar2 = Type::isValidArrayOrVectorRange<unsigned_long>
                        (this_00,this->fixedStartIndex,this->fixedEndIndex);
      if (!bVar2) {
        throwInternalCompilerError
                  ("aggregateType.isUnsizedArray() || aggregateType.isValidArrayOrVectorRange (fixedStartIndex, fixedEndIndex)"
                   ,"getType",0x21b);
      }
    }
    else {
      if (CVar1 != array) {
        throwInternalCompilerError
                  ("aggregateType.isArray() || aggregateType.isVector()","getType",0x21a);
      }
      if (this_00->boundingSize != 0) goto LAB_0026c0cf;
    }
    Type::createCopyWithNewArraySize(&TStack_38,this_00,newSize);
    Type::operator=(&this->temporaryType,&TStack_38);
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_38.structure);
LAB_0026c11e:
  return &this->temporaryType;
}

Assistant:

const Type& getType() const override
        {
            const auto& aggregateType = parent->getType();
            auto sliceSize = getSliceSize();

            if (sliceSize == 1)
            {
                if (aggregateType.isPrimitive())
                    temporaryType = aggregateType;
                else
                    temporaryType = aggregateType.getElementType();
            }
            else
            {
                SOUL_ASSERT (aggregateType.isArray() || aggregateType.isVector());
                SOUL_ASSERT (aggregateType.isUnsizedArray() || aggregateType.isValidArrayOrVectorRange (fixedStartIndex, fixedEndIndex));

                temporaryType = aggregateType.createCopyWithNewArraySize (sliceSize);
            }

            return temporaryType;
        }